

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O0

void __thiscall
duckdb::SerializedCSVReaderOptions::Serialize
          (SerializedCSVReaderOptions *this,Serializer *serializer)

{
  CSVOption<char> *value;
  CSVOption<char> *in_RSI;
  long in_RDI;
  CSVReaderOptions *in_stack_fffffffffffffec8;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffed0;
  CSVReaderOptions *in_stack_fffffffffffffed8;
  field_id_t fVar1;
  Serializer *in_stack_fffffffffffffee0;
  Serializer *this_00;
  undefined8 in_stack_fffffffffffffee8;
  Serializer *in_stack_fffffffffffffef0;
  undefined1 local_9c [4];
  string local_98 [74];
  CSVOption<char> local_4e;
  allocator local_39;
  string local_38 [39];
  undefined1 local_11;
  CSVOption<char> *local_10;
  
  fVar1 = (field_id_t)((ulong)in_stack_fffffffffffffee8 >> 0x30);
  local_11 = 0;
  local_10 = in_RSI;
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffef0,fVar1,(char *)in_stack_fffffffffffffee0,
             (CSVOption<bool> *)in_stack_fffffffffffffed8,&in_stack_fffffffffffffed0->set_by_user);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(unsigned_long *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::FileCompressionType>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (FileCompressionType *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(bool *)in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::CSVOption<unsigned_long>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (CSVOption<unsigned_long> *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(bool *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<duckdb::vector<bool,true>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(vector<bool,_true> *)in_stack_fffffffffffffec8
            );
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(bool *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(unsigned_long *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(bool *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(bool *)in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::MultiFileOptions>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(MultiFileOptions *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<duckdb::vector<bool,true>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(vector<bool,_true> *)in_stack_fffffffffffffec8
            );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"reject_errors",&local_39);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffffef0,fVar1,(char *)in_stack_fffffffffffffee0,
             (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffed8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffed0);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(unsigned_long *)in_stack_fffffffffffffec8);
  local_4e = CSVReaderOptions::GetSingleByteDelimiter(in_stack_fffffffffffffed8);
  Serializer::WriteProperty<duckdb::CSVOption<char>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(CSVOption<char> *)in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::CSVOption<char>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(CSVOption<char> *)in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::CSVOption<char>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(CSVOption<char> *)in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::CSVOption<bool>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(CSVOption<bool> *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(unsigned_long *)in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::CSVOption<duckdb::NewLineIdentifier>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (CSVOption<duckdb::NewLineIdentifier> *)in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::CSVOption<unsigned_long>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (CSVOption<unsigned_long> *)in_stack_fffffffffffffec8);
  Serializer::
  WriteProperty<std::map<duckdb::LogicalTypeId,duckdb::CSVOption<duckdb::StrpTimeFormat>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::CSVOption<duckdb::StrpTimeFormat>>>>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
              *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(bool *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<duckdb::vector<bool,true>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,(vector<bool,_true> *)in_stack_fffffffffffffec8
            );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_98,"reject_scans",(allocator *)(local_9c + 3));
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CSVOption(in_stack_fffffffffffffed0,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<duckdb::CSVOption<std::__cxx11::string>>
            (in_stack_fffffffffffffef0,fVar1,(char *)in_stack_fffffffffffffee0,
             (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~CSVOption((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0xadbdba);
  ::std::__cxx11::string::~string(local_98);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_9c + 3));
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffec8);
  Serializer::
  WritePropertyWithDefault<std::unordered_map<std::__cxx11::string,unsigned_long,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>>
            (in_stack_fffffffffffffee0,(field_id_t)((ulong)in_stack_fffffffffffffed8 >> 0x30),
             &in_stack_fffffffffffffed0->set_by_user,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)in_stack_fffffffffffffec8);
  local_9c[2] = 0;
  Serializer::WritePropertyWithDefault<bool>
            (in_stack_fffffffffffffef0,fVar1,(char *)in_stack_fffffffffffffee0,
             (bool *)in_stack_fffffffffffffed8,&in_stack_fffffffffffffed0->set_by_user);
  value = (CSVOption<char> *)(in_RDI + 0x2c);
  this_00 = (Serializer *)local_9c;
  CSVOption<char>::CSVOption((CSVOption<char> *)this_00,'\0');
  Serializer::WritePropertyWithDefault<duckdb::CSVOption<char>>
            (in_stack_fffffffffffffef0,fVar1,(char *)this_00,value,local_10);
  fVar1 = (field_id_t)((ulong)value >> 0x30);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (this_00,fVar1,&local_10->set_by_user,(unsigned_long *)in_stack_fffffffffffffec8);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (this_00,fVar1,&local_10->set_by_user,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::CSVOption<bool>>
            (this_00,fVar1,&local_10->set_by_user,(CSVOption<bool> *)in_stack_fffffffffffffec8);
  CSVReaderOptions::GetMultiByteDelimiter_abi_cxx11_(in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::CSVOption<std::__cxx11::string>>
            (this_00,fVar1,&local_10->set_by_user,
             (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffec8);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~CSVOption((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0xadbf7b);
  Serializer::WritePropertyWithDefault<bool>
            (this_00,fVar1,&local_10->set_by_user,(bool *)in_stack_fffffffffffffec8);
  Serializer::WriteProperty<duckdb::CSVOption<unsigned_long>>
            (this_00,fVar1,&local_10->set_by_user,
             (CSVOption<unsigned_long> *)in_stack_fffffffffffffec8);
  return;
}

Assistant:

void SerializedCSVReaderOptions::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<bool>(100, "ignore_errors", options.ignore_errors, false);
	serializer.WritePropertyWithDefault<idx_t>(101, "buffer_sample_size", options.buffer_sample_size);
	serializer.WritePropertyWithDefault<vector<string>>(102, "null_str", options.null_str);
	serializer.WriteProperty<FileCompressionType>(103, "compression", options.compression);
	serializer.WritePropertyWithDefault<bool>(104, "allow_quoted_nulls", options.allow_quoted_nulls);
	serializer.WriteProperty<CSVOption<idx_t>>(105, "maximum_line_size", options.maximum_line_size);
	serializer.WritePropertyWithDefault<bool>(106, "normalize_names", options.normalize_names);
	serializer.WritePropertyWithDefault<vector<bool>>(107, "force_not_null", options.force_not_null);
	serializer.WritePropertyWithDefault<bool>(108, "all_varchar", options.all_varchar);
	serializer.WritePropertyWithDefault<idx_t>(109, "sample_size_chunks", options.sample_size_chunks);
	serializer.WritePropertyWithDefault<bool>(110, "auto_detect", options.auto_detect);
	serializer.WritePropertyWithDefault<string>(111, "file_path", options.file_path);
	serializer.WritePropertyWithDefault<string>(112, "decimal_separator", options.decimal_separator);
	serializer.WritePropertyWithDefault<bool>(113, "null_padding", options.null_padding);
	/* [Deleted] (idx_t) "buffer_size" */
	serializer.WriteProperty<MultiFileOptions>(115, "file_options", file_options);
	serializer.WritePropertyWithDefault<vector<bool>>(116, "force_quote", options.force_quote);
	serializer.WritePropertyWithDefault<string>(117, "rejects_table_name", options.rejects_table_name, "reject_errors");
	serializer.WritePropertyWithDefault<idx_t>(118, "rejects_limit", options.rejects_limit);
	/* [Deleted] (vector<string>) "rejects_recovery_columns" */
	/* [Deleted] (vector<idx_t>) "rejects_recovery_column_ids" */
	serializer.WriteProperty<CSVOption<char>>(121, "delimiter", options.GetSingleByteDelimiter());
	serializer.WriteProperty<CSVOption<char>>(122, "quote", options.dialect_options.state_machine_options.quote);
	serializer.WriteProperty<CSVOption<char>>(123, "escape", options.dialect_options.state_machine_options.escape);
	serializer.WriteProperty<CSVOption<bool>>(124, "header", options.dialect_options.header);
	serializer.WritePropertyWithDefault<idx_t>(125, "num_cols", options.dialect_options.num_cols);
	serializer.WriteProperty<CSVOption<NewLineIdentifier>>(126, "new_line", options.dialect_options.state_machine_options.new_line);
	serializer.WriteProperty<CSVOption<idx_t>>(127, "skip_rows", options.dialect_options.skip_rows);
	serializer.WriteProperty<map<LogicalTypeId, CSVOption<StrpTimeFormat>>>(128, "date_format", options.dialect_options.date_format);
	serializer.WritePropertyWithDefault<string>(129, "sniffer_user_mismatch_error", options.sniffer_user_mismatch_error);
	serializer.WritePropertyWithDefault<bool>(130, "parallel", options.parallel);
	serializer.WritePropertyWithDefault<vector<bool>>(131, "was_type_manually_set", options.was_type_manually_set);
	serializer.WritePropertyWithDefault<CSVOption<string>>(132, "rejects_scan_name", options.rejects_scan_name, {"reject_scans"});
	serializer.WritePropertyWithDefault<vector<string>>(133, "name_list", options.name_list);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(134, "sql_type_list", options.sql_type_list);
	serializer.WritePropertyWithDefault<case_insensitive_map_t<idx_t>>(135, "sql_types_per_column", options.sql_types_per_column);
	serializer.WritePropertyWithDefault<bool>(136, "columns_set", options.columns_set, false);
	serializer.WritePropertyWithDefault<CSVOption<char>>(137, "comment", options.dialect_options.state_machine_options.comment, CSVOption<char>('\0'));
	serializer.WritePropertyWithDefault<idx_t>(138, "rows_until_header", options.dialect_options.rows_until_header);
	serializer.WritePropertyWithDefault<string>(139, "encoding", options.encoding);
	serializer.WriteProperty<CSVOption<bool>>(140, "strict_mode", options.dialect_options.state_machine_options.strict_mode);
	serializer.WriteProperty<CSVOption<string>>(141, "multi_byte_delimiter", options.GetMultiByteDelimiter());
	serializer.WritePropertyWithDefault<bool>(142, "multi_file_reader", options.multi_file_reader);
	serializer.WriteProperty<CSVOption<idx_t>>(143, "buffer_size_option", options.buffer_size_option);
}